

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blech32.c
# Opt level: O2

int main(void)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  size_t written_1;
  char *local_f8;
  char *blech32_1;
  size_t written;
  char *blech32;
  uchar pub_key [33];
  
  written = 0;
  blech32 = (char *)0x0;
  iVar4 = wally_hex_to_bytes("03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",
                             pub_key,0x21,&written);
  if ((iVar4 == 0) && (written == 0x21)) {
    iVar4 = wally_confidential_addr_from_addr_segwit
                      ("ert1qu6ssk77c466kg3x9wd82dqkd9udddykyfykm9k","ert","el",pub_key,0x21,
                       &blech32);
    pcVar1 = blech32;
    if (iVar4 != 0) goto LAB_001012d3;
    iVar4 = strncmp(blech32,
                    "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqpe4ppdaa3t44v3zv2u6w56pv6tc666fvgzaclqjnkz0sd"
                    ,0x66);
    wally_free_string(pcVar1);
    if (iVar4 != 0) goto LAB_001012d3;
    uVar5 = 1;
  }
  else {
LAB_001012d3:
    puts("check_confidential_addr_from_addr_segwit(pubkey) test failed!");
    uVar5 = 0;
  }
  written_1 = 0;
  blech32_1 = (char *)0x0;
  local_f8 = (char *)0x0;
  iVar4 = wally_hex_to_bytes("03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",
                             (uchar *)&blech32,0x21,&written_1);
  if ((iVar4 == 0) && (written_1 == 0x21)) {
    iVar4 = wally_hex_to_bytes("0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6"
                               ,(uchar *)&written,0x22,&written_1);
    if ((iVar4 != 0) || (written_1 != 0x22)) goto LAB_001013f6;
    iVar4 = wally_addr_segwit_from_bytes((uchar *)&written,0x22,"ert",0,&local_f8);
    pcVar1 = local_f8;
    if (iVar4 != 0) goto LAB_001013f6;
    strcpy((char *)pub_key,local_f8);
    wally_free_string(pcVar1);
    iVar4 = bcmp(pub_key,"ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g",0x40);
    if (iVar4 != 0) goto LAB_001013f6;
    iVar4 = wally_confidential_addr_from_addr_segwit
                      ((char *)pub_key,"ert","el",(uchar *)&blech32,0x21,&blech32_1);
    pcVar1 = blech32_1;
    if (iVar4 != 0) goto LAB_001013f6;
    iVar4 = strncmp(blech32_1,
                    "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
                    ,0x79);
    wally_free_string(pcVar1);
    if (iVar4 != 0) goto LAB_001013f6;
  }
  else {
LAB_001013f6:
    puts("check_confidential_addr_from_addr_segwit(script) test failed!");
    uVar5 = 0;
  }
  pub_key[0] = '\0';
  pub_key[1] = '\0';
  pub_key[2] = '\0';
  pub_key[3] = '\0';
  pub_key[4] = '\0';
  pub_key[5] = '\0';
  pub_key[6] = '\0';
  pub_key[7] = '\0';
  iVar4 = wally_confidential_addr_to_addr_segwit
                    ("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqpe4ppdaa3t44v3zv2u6w56pv6tc666fvgzaclqjnkz0sd"
                     ,"el","ert",(char **)pub_key);
  uVar3 = pub_key._0_8_;
  if (iVar4 == 0) {
    iVar4 = strcmp((char *)pub_key._0_8_,"ert1qu6ssk77c466kg3x9wd82dqkd9udddykyfykm9k");
    wally_free_string((char *)uVar3);
    if (iVar4 != 0) goto LAB_00101453;
  }
  else {
LAB_00101453:
    puts("check_confidential_addr_to_addr_segwit(pubkey) test failed!");
    uVar5 = 0;
  }
  pub_key[0] = '\0';
  pub_key[1] = '\0';
  pub_key[2] = '\0';
  pub_key[3] = '\0';
  pub_key[4] = '\0';
  pub_key[5] = '\0';
  pub_key[6] = '\0';
  pub_key[7] = '\0';
  iVar4 = wally_confidential_addr_to_addr_segwit
                    ("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
                     ,"el","ert",(char **)pub_key);
  uVar3 = pub_key._0_8_;
  if (iVar4 == 0) {
    iVar4 = strcmp((char *)pub_key._0_8_,
                   "ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g");
    wally_free_string((char *)uVar3);
    if (iVar4 != 0) goto LAB_001014b0;
  }
  else {
LAB_001014b0:
    puts("check_confidential_addr_to_addr_segwit(script) test failed!");
    uVar5 = 0;
  }
  written = 0;
  iVar4 = wally_confidential_addr_segwit_to_ec_public_key
                    ("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqpe4ppdaa3t44v3zv2u6w56pv6tc666fvgzaclqjnkz0sd"
                     ,"el",pub_key,0x21);
  if (iVar4 == 0) {
    iVar4 = wally_hex_from_bytes(pub_key,0x21,(char **)&written);
    sVar2 = written;
    if (iVar4 != 0) goto LAB_00101521;
    iVar4 = strcmp((char *)written,
                   "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");
    wally_free_string((char *)sVar2);
    if (iVar4 != 0) goto LAB_00101521;
  }
  else {
LAB_00101521:
    puts("check_confidential_addr_segwit_to_ec_public_key(pubkey) test failed!");
    uVar5 = 0;
  }
  written = 0;
  iVar4 = wally_confidential_addr_segwit_to_ec_public_key
                    ("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
                     ,"el",pub_key,0x21);
  if (iVar4 == 0) {
    iVar4 = wally_hex_from_bytes(pub_key,0x21,(char **)&written);
    sVar2 = written;
    if (iVar4 == 0) {
      iVar4 = strcmp((char *)written,
                     "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");
      wally_free_string((char *)sVar2);
      if (iVar4 == 0) goto LAB_001015a0;
    }
  }
  puts("check_confidential_addr_segwit_to_ec_public_key(script) test failed!");
  uVar5 = 0;
LAB_001015a0:
  return uVar5 ^ 1;
}

Assistant:

int main(void)
{
    bool tests_ok = true;

    if (!check_confidential_addr_from_addr_segwit_pubkey()) {
        printf("check_confidential_addr_from_addr_segwit(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_from_addr_segwit_script()) {
        printf("check_confidential_addr_from_addr_segwit(script) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_to_addr_segwit_pubkey()) {
        printf("check_confidential_addr_to_addr_segwit(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_to_addr_segwit_script()) {
        printf("check_confidential_addr_to_addr_segwit(script) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_segwit_to_ec_public_key_pubkey()) {
        printf("check_confidential_addr_segwit_to_ec_public_key(pubkey) test failed!\n");
        tests_ok = false;
    }

    if (!check_confidential_addr_segwit_to_ec_public_key_script()) {
        printf("check_confidential_addr_segwit_to_ec_public_key(script) test failed!\n");
        tests_ok = false;
    }

    return tests_ok ? 0 : 1;
}